

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::torrent::should_check_files(torrent *this)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar1 & 0xe00000008000000) == 0x200000000000000) {
    bVar3 = false;
    uVar2 = (uint)uVar1;
    if (((uVar2 >> 0x1a & 1) == 0) && ((this->m_error).failed_ == false)) {
      bVar3 = (uVar2 >> 0x1c & 1) == 0;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool torrent::should_check_files() const
	{
		TORRENT_ASSERT(is_single_thread());
		return m_state == torrent_status::checking_files
			&& !m_paused
			&& !has_error()
			&& !m_abort
			&& !m_session_paused;
	}